

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<unsigned_char,_1U>::resample
          (ImageT<unsigned_char,_1U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  _func_int *p_Var1;
  uint uVar2;
  uint32_t uVar3;
  _func_int **pp_Var4;
  TransferFunctionSRGB __p;
  char cVar5;
  undefined1 uVar6;
  long lVar7;
  runtime_error *this_00;
  uint32_t sourceX;
  ulong uVar8;
  int iVar9;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  uint uVar10;
  unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *puVar11;
  float fVar12;
  string_view fmt;
  format_args args;
  uint32_t sourceWidth;
  uint32_t targetWidth_local;
  _func_int **local_c8;
  uint32_t sourceHeight;
  uint32_t targetHeight_local;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL> resamplers
  ;
  char *filter_local;
  Boundary_Op wrapMode_local;
  float filterScale_local;
  long local_98;
  TransferFunctionSRGB tfSRGB;
  array<std::vector<float,_std::allocator<float>_>,_1UL> samples;
  TransferFunctionLinear tfLinear;
  float local_44;
  undefined8 local_40;
  float local_38 [2];
  
  filter_local = (char *)CONCAT44(in_register_00000084,wrapMode);
  lVar7 = CONCAT44(in_register_00000034,targetWidth);
  targetHeight_local = (uint32_t)filter;
  wrapMode_local = in_R9._0_4_;
  targetWidth_local = targetHeight;
  filterScale_local = filterScale;
  std::make_unique<ImageT<unsigned_char,1u>,unsigned_int&,unsigned_int&>
            ((uint *)&local_c8,&targetWidth_local);
  local_c8[2] = *(_func_int **)(lVar7 + 0x10);
  sourceWidth = *(uint *)(lVar7 + 8);
  sourceHeight = *(uint *)(lVar7 + 0xc);
  if ((sourceWidth != 0) && (sourceHeight != 0)) {
    if ((targetWidth_local != 0) && (targetHeight_local != 0)) {
      uVar10 = sourceHeight;
      if (sourceHeight < sourceWidth) {
        uVar10 = sourceWidth;
      }
      uVar2 = targetHeight_local;
      if (targetHeight_local < targetWidth_local) {
        uVar2 = targetWidth_local;
      }
      local_98 = lVar7;
      if ((uVar10 < 0x4001) && (uVar2 < 0x4001)) {
        samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        resamplers._M_elems[0]._M_t.
        super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
        super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
             (_Type)(unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
        local_40._4_4_ = 0;
        samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_40._0_4_ = 0x3f800000;
        tfLinear.super_TransferFunction._vptr_TransferFunction = (TransferFunction)(_func_int **)0x0
        ;
        local_38[0] = 0.0;
        local_38[1] = 0.0;
        local_44 = 0.0;
        std::
        make_unique<basisu::Resampler,unsigned_int_const&,unsigned_int_const&,unsigned_int&,unsigned_int&,basisu::Resampler::Boundary_Op&,float,float,char_const*&,basisu::Resampler::Contrib_List*,basisu::Resampler::Contrib_List*,float&,float&,float,float>
                  ((uint *)&tfSRGB,&sourceWidth,&sourceHeight,&targetWidth_local,&targetHeight_local
                   ,(float *)&wrapMode_local,(float *)((long)&local_40 + 4),(char **)&local_40,
                   (Contrib_List **)&filter_local,(Contrib_List **)&tfLinear,local_38,
                   &filterScale_local,&filterScale_local,&local_44);
        __p = tfSRGB;
        tfSRGB.super_TransferFunction._vptr_TransferFunction = (TransferFunction)(_func_int **)0x0;
        std::__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::reset
                  ((__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                   &resamplers,(pointer)__p.super_TransferFunction._vptr_TransferFunction);
        std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                  ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)&tfSRGB
                  );
        checkResamplerStatus
                  ((Resampler *)
                   resamplers._M_elems[0]._M_t.
                   super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                   .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl,filter_local);
        std::vector<float,_std::allocator<float>_>::resize(samples._M_elems,(ulong)sourceWidth);
        tfSRGB.super_TransferFunction._vptr_TransferFunction =
             (TransferFunction)&PTR_encode_001a88d8;
        tfLinear.super_TransferFunction._vptr_TransferFunction =
             (TransferFunction)&PTR_encode_001a8930;
        puVar11 = (unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                  &tfLinear;
        if (*(int *)(local_98 + 0x10) == 2) {
          puVar11 = (unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                    &tfSRGB;
        }
        iVar9 = 0;
        for (uVar10 = 0; lVar7 = local_98, pp_Var4 = local_c8, uVar10 < sourceHeight;
            uVar10 = uVar10 + 1) {
          for (uVar8 = 0; uVar8 < sourceWidth; uVar8 = uVar8 + 1) {
            fVar12 = (float)(**(code **)((puVar11->_M_t).
                                         super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                         .super__Head_base<0UL,_basisu::Resampler_*,_false>.
                                         _M_head_impl + 8))
                                      ((float)*(byte *)(*(long *)(lVar7 + 0x18) +
                                                       (ulong)(sourceWidth * uVar10 + (int)uVar8)) *
                                       0.003921569,puVar11);
            samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] = fVar12;
          }
          cVar5 = basisu::Resampler::put_line
                            ((float *)resamplers._M_elems[0]._M_t.
                                      super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                      .super__Head_base<0UL,_basisu::Resampler_*,_false>.
                                      _M_head_impl);
          if (cVar5 == '\0') {
            checkResamplerStatus
                      ((Resampler *)
                       resamplers._M_elems[0]._M_t.
                       super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                       .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl,filter_local)
            ;
          }
          while( true ) {
            lVar7 = basisu::Resampler::get_line();
            if (lVar7 == 0) break;
            for (uVar8 = 0; uVar3 = targetWidth_local, uVar8 < targetWidth_local; uVar8 = uVar8 + 1)
            {
              p_Var1 = local_c8[3];
              fVar12 = (float)(**(code **)(puVar11->_M_t).
                                          super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                          .super__Head_base<0UL,_basisu::Resampler_*,_false>.
                                          _M_head_impl)(*(undefined4 *)(lVar7 + uVar8 * 4),puVar11);
              if (0.0 <= fVar12) {
                uVar6 = 0xff;
                if (fVar12 <= 1.0) {
                  uVar6 = (undefined1)(int)(fVar12 * 255.0 + 0.5);
                }
              }
              else {
                uVar6 = 0;
              }
              p_Var1[uVar3 * iVar9 + (int)uVar8] = (_func_int)uVar6;
            }
            iVar9 = iVar9 + 1;
          }
        }
        local_c8 = (_func_int **)0x0;
        (this->super_Image)._vptr_Image = pp_Var4;
        std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                  (resamplers._M_elems);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&samples);
        if (local_c8 != (_func_int **)0x0) {
          (**(code **)(*local_c8 + 8))();
        }
        return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
               (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      resamplers._M_elems[0]._M_t.
      super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
      super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
      super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
           (_Type)(unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x4000;
      fmt.size_ = 1;
      fmt.data_ = (char *)0x2a;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&resamplers;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&samples,(v10 *)"Image larger than max supported size of {}",fmt,args);
      std::runtime_error::runtime_error(this_00,(string *)&samples);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x461,
                "virtual std::unique_ptr<Image> ImageT<unsigned char, 1>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = unsigned char, componentCount = 1]"
               );
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }